

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngstest.c
# Opt level: O0

void gpc_gpre(Pixel *out,Pixel *in,Background *back)

{
  int iVar1;
  png_uint_16 pVar2;
  double dVar3;
  Background *back_local;
  Pixel *in_local;
  Pixel *out_local;
  
  if ((in->r == in->g) && (in->g == in->b)) {
    pVar2 = ilineara(in->g,in->a);
    out->b = (uint)pVar2;
    out->g = (uint)pVar2;
    out->r = (uint)pVar2;
  }
  else {
    iVar1 = in->a;
    dVar3 = YfromRGB(sRGB_to_d[in->r],sRGB_to_d[in->g],sRGB_to_d[in->b]);
    pVar2 = u16d((double)(iVar1 * 0x101) * dVar3);
    out->b = (uint)pVar2;
    out->g = (uint)pVar2;
    out->r = (uint)pVar2;
  }
  out->a = in->a * 0x101;
  return;
}

Assistant:

static void
gpc_gpre(Pixel *out, const Pixel *in, const Background *back)
{
   (void)back;

   if (in->r == in->g && in->g == in->b)
      out->r = out->g = out->b = ilineara(in->g, in->a);

   else
      out->r = out->g = out->b = u16d(in->a * 257 *
         YfromRGB(sRGB_to_d[in->r], sRGB_to_d[in->g], sRGB_to_d[in->b]));

   out->a = 257 * in->a;
}